

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O2

bool __thiscall MT32Emu::Poly::startDecay(Poly *this)

{
  PolyState PVar1;
  int t;
  long lVar2;
  
  PVar1 = this->state & ~POLY_Held;
  if (PVar1 != POLY_Releasing) {
    setState(this,POLY_Releasing);
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      if (this->partials[lVar2] != (Partial *)0x0) {
        Partial::startDecayAll(this->partials[lVar2]);
      }
    }
  }
  return PVar1 != POLY_Releasing;
}

Assistant:

bool Poly::startDecay() {
	if (state == POLY_Inactive || state == POLY_Releasing) {
		return false;
	}
	setState(POLY_Releasing);

	for (int t = 0; t < 4; t++) {
		Partial *partial = partials[t];
		if (partial != NULL) {
			partial->startDecayAll();
		}
	}
	return true;
}